

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::ParseableFunctionInfo::Finalize(ParseableFunctionInfo *this,bool isShutdown)

{
  LocalFunctionId functionID;
  FunctionInfo *pFVar1;
  Utf8SourceInfo *this_00;
  bool isShutdown_local;
  ParseableFunctionInfo *this_local;
  
  FunctionProxy::Finalize(&this->super_FunctionProxy,isShutdown);
  pFVar1 = FunctionProxy::GetFunctionInfo(&this->super_FunctionProxy);
  if (pFVar1 != (FunctionInfo *)0x0) {
    this_00 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
    functionID = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
    Utf8SourceInfo::StopTrackingDeferredFunction(this_00,functionID);
  }
  return;
}

Assistant:

void ParseableFunctionInfo::Finalize(bool isShutdown)
    {
        __super::Finalize(isShutdown);
        if (this->GetFunctionInfo())
        {
            // (If function info was never set, then initialization didn't finish, so there's nothing to remove from the dictionary.)
            this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
        }
        if (!this->m_hasBeenParsed)
        {
            PERF_COUNTER_DEC(Code, DeferredFunction);
        }
    }